

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_cr.c
# Opt level: O2

void byte_copyr(char *to,uint n,char *from)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  
  pcVar2 = to + -1;
  pcVar1 = from + -1;
  for (uVar3 = 0;
      (((n != uVar3 && (pcVar2[n] = pcVar1[n], n - 1 != uVar3)) &&
       (pcVar2[(ulong)n - 1] = pcVar1[(ulong)n - 1], n - 2 != uVar3)) &&
      (pcVar2[(ulong)n - 2] = pcVar1[(ulong)n - 2], n - 3 != uVar3)); uVar3 = uVar3 + 4) {
    pcVar2[(ulong)n - 3] = pcVar1[(ulong)n - 3];
    pcVar2 = pcVar2 + -4;
    pcVar1 = pcVar1 + -4;
  }
  return;
}

Assistant:

void byte_copyr(to,n,from)
register char *to;
register unsigned int n;
register char *from;
{
  to += n;
  from += n;
  for (;;) {
    if (!n) return; *--to = *--from; --n;
    if (!n) return; *--to = *--from; --n;
    if (!n) return; *--to = *--from; --n;
    if (!n) return; *--to = *--from; --n;
  }
}